

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void checkList(IntegrityCk *pCheck,int isFreeList,int iPage,int N)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  uint *puVar5;
  bool bVar6;
  DbPage *pPg;
  int iVar7;
  u32 uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  DbPage *pOvflPage;
  DbPage *local_38;
  
  uVar10 = iPage;
  uVar12 = N;
  while( true ) {
    if ((int)uVar12 < 1) {
      return;
    }
    if (pCheck->mxErr == 0) break;
    uVar13 = uVar12 - 1;
    if ((int)uVar10 < 1) {
      bVar6 = false;
      checkAppendMsg(pCheck,"%d of %d pages missing from overflow list starting at %d",(ulong)uVar12
                     ,(ulong)(uint)N,(ulong)(uint)iPage);
      uVar12 = uVar13;
    }
    else {
      iVar7 = checkRef(pCheck,uVar10);
      if (iVar7 == 0) {
        iVar7 = sqlite3PagerAcquire(pCheck->pPager,uVar10,&local_38,0);
        pPg = local_38;
        if (iVar7 == 0) {
          puVar5 = (uint *)local_38->pData;
          if (isFreeList == 0) {
            if ((uVar12 != 1) && (pCheck->pBt->autoVacuum != '\0')) {
              uVar12 = *puVar5;
              checkPtrmap(pCheck,uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8
                                 | uVar12 << 0x18,'\x04',uVar10);
            }
          }
          else {
            uVar9 = puVar5[1];
            bVar1 = *(byte *)((long)puVar5 + 5);
            bVar2 = *(byte *)((long)puVar5 + 6);
            bVar3 = *(byte *)((long)puVar5 + 7);
            if (pCheck->pBt->autoVacuum != '\0') {
              checkPtrmap(pCheck,uVar10,'\x02',0);
            }
            iVar7 = (uint)(byte)uVar9 * 0x1000000;
            iVar11 = (uint)bVar1 * 0x10000;
            uVar15 = (uint)bVar2 * 0x100;
            uVar9 = iVar11 + iVar7 | uVar15 | (uint)bVar3;
            uVar4 = pCheck->pBt->usableSize;
            uVar8 = uVar4 + 3;
            if (-1 < (int)uVar4) {
              uVar8 = uVar4;
            }
            if (((int)uVar8 >> 2) + -2 < (int)uVar9) {
              checkAppendMsg(pCheck,"freelist leaf count too big on page %d",(ulong)uVar10);
              uVar13 = uVar12 - 2;
            }
            else {
              if (0 < (int)uVar9) {
                uVar14 = 0;
                do {
                  uVar10 = puVar5[uVar14 + 2];
                  uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                           uVar10 << 0x18;
                  if (pCheck->pBt->autoVacuum != '\0') {
                    checkPtrmap(pCheck,uVar10,'\x02',0);
                  }
                  checkRef(pCheck,uVar10);
                  uVar14 = uVar14 + 1;
                } while (uVar15 + bVar3 + iVar7 + iVar11 != uVar14);
              }
              uVar13 = uVar13 - uVar9;
            }
          }
          uVar10 = *puVar5;
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          bVar6 = true;
          uVar12 = uVar13;
          if (pPg != (DbPage *)0x0) {
            sqlite3PagerUnrefNotNull(pPg);
          }
        }
        else {
          bVar6 = false;
          checkAppendMsg(pCheck,"failed to get page %d",(ulong)uVar10);
          uVar12 = uVar13;
        }
      }
      else {
        bVar6 = false;
        uVar12 = uVar13;
      }
    }
    if (!bVar6) {
      return;
    }
  }
  return;
}

Assistant:

static void checkList(
  IntegrityCk *pCheck,  /* Integrity checking context */
  int isFreeList,       /* True for a freelist.  False for overflow page list */
  int iPage,            /* Page number for first page in the list */
  int N                 /* Expected number of pages in the list */
){
  int i;
  int expected = N;
  int iFirst = iPage;
  while( N-- > 0 && pCheck->mxErr ){
    DbPage *pOvflPage;
    unsigned char *pOvflData;
    if( iPage<1 ){
      checkAppendMsg(pCheck,
         "%d of %d pages missing from overflow list starting at %d",
          N+1, expected, iFirst);
      break;
    }
    if( checkRef(pCheck, iPage) ) break;
    if( sqlite3PagerGet(pCheck->pPager, (Pgno)iPage, &pOvflPage) ){
      checkAppendMsg(pCheck, "failed to get page %d", iPage);
      break;
    }
    pOvflData = (unsigned char *)sqlite3PagerGetData(pOvflPage);
    if( isFreeList ){
      int n = get4byte(&pOvflData[4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pCheck->pBt->autoVacuum ){
        checkPtrmap(pCheck, iPage, PTRMAP_FREEPAGE, 0);
      }
#endif
      if( n>(int)pCheck->pBt->usableSize/4-2 ){
        checkAppendMsg(pCheck,
           "freelist leaf count too big on page %d", iPage);
        N--;
      }else{
        for(i=0; i<n; i++){
          Pgno iFreePage = get4byte(&pOvflData[8+i*4]);
#ifndef SQLITE_OMIT_AUTOVACUUM
          if( pCheck->pBt->autoVacuum ){
            checkPtrmap(pCheck, iFreePage, PTRMAP_FREEPAGE, 0);
          }
#endif
          checkRef(pCheck, iFreePage);
        }
        N -= n;
      }
    }
#ifndef SQLITE_OMIT_AUTOVACUUM
    else{
      /* If this database supports auto-vacuum and iPage is not the last
      ** page in this overflow list, check that the pointer-map entry for
      ** the following page matches iPage.
      */
      if( pCheck->pBt->autoVacuum && N>0 ){
        i = get4byte(pOvflData);
        checkPtrmap(pCheck, i, PTRMAP_OVERFLOW2, iPage);
      }
    }
#endif
    iPage = get4byte(pOvflData);
    sqlite3PagerUnref(pOvflPage);
  }
}